

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIndexingTests.cpp
# Opt level: O3

int __thiscall deqp::ShaderIndexingTests::init(ShaderIndexingTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  GLSLVersion GVar2;
  Context *pCVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  _Alloc_hider _Var7;
  _Alloc_hider _Var8;
  uint number;
  uint uVar9;
  int vecSize;
  DataType dataType;
  int iVar10;
  TestNode *pTVar11;
  char *pcVar12;
  long *plVar13;
  size_t sVar14;
  ShaderIndexingCase *pSVar15;
  ostringstream *poVar16;
  uint uVar17;
  long *plVar18;
  size_type *psVar19;
  _func_int **pp_Var20;
  long lVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  char *pcVar25;
  long lVar26;
  char *pcVar27;
  long lVar28;
  long lVar29;
  ostringstream *poVar30;
  ShaderEvalFunc p_Var31;
  ulong uVar32;
  long lVar33;
  bool bVar34;
  bool bVar35;
  StringTemplate vertTemplate;
  _Alloc_hider local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  string vertexShaderSource;
  allocator<char> local_459;
  StringTemplate fragTemplate;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  string local_3f8;
  Context *local_3d8;
  string desc;
  string name;
  uint local_388;
  uint local_350;
  long local_330;
  ostringstream vtx;
  ostringstream frag;
  
  pTVar11 = (TestNode *)operator_new(0x78);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,pCVar3->m_testCtx,"varying_array",
             "Varying array access tests.");
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_0210b040;
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar3;
  tcu::TestNode::addChild((TestNode *)this,pTVar11);
  lVar22 = 0;
  do {
    DVar1 = deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes[lVar22];
    lVar21 = 0;
    do {
      lVar24 = 0x26;
      if (lVar21 == 2) {
        lVar24 = 0x20;
      }
      pcVar25 = "    for (int i = 0; i < ui_four; i++)\n";
      if (lVar21 == 2) {
        pcVar25 = "    for (int i = 0; i < 4; i++)\n";
      }
      lVar26 = 0x1d;
      if (lVar21 == 1) {
        lVar26 = 0x37;
      }
      pcVar27 = "uniform mediump int ui_four;\n";
      if (lVar21 == 1) {
        pcVar27 = "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n";
      }
      local_388 = (uint)lVar21 | 2;
      lVar29 = 0;
      do {
        if ((int)lVar29 != 0 || (uint)lVar21 != 0) {
          pcVar12 = glu::getDataTypeName(DVar1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fragTemplate,pcVar12,(allocator<char> *)&vertexShaderSource);
          plVar13 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
          params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
          ;
          plVar18 = plVar13 + 2;
          if ((long *)*plVar13 == plVar18) {
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar18;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar13[3];
          }
          else {
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar18;
            params._M_t._M_impl._0_8_ = (long *)*plVar13;
          }
          params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar13[1];
          *plVar13 = (long)plVar18;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&params);
          vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
          psVar19 = (size_type *)(plVar13 + 2);
          if ((size_type *)*plVar13 == psVar19) {
            vertTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
            vertTemplate.m_template.field_2._8_8_ = plVar13[3];
          }
          else {
            vertTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
            vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar13;
          }
          vertTemplate.m_template._M_string_length = plVar13[1];
          *plVar13 = (long)psVar19;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
          frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
          pp_Var20 = (_func_int **)(plVar13 + 2);
          if ((_func_int **)*plVar13 == pp_Var20) {
            frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
            frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar13[3];
          }
          else {
            frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
            frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)*plVar13;
          }
          frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar13[1];
          *plVar13 = (long)pp_Var20;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&frag);
          vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
          pp_Var20 = (_func_int **)(plVar13 + 2);
          if ((_func_int **)*plVar13 == pp_Var20) {
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar13[3];
          }
          else {
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)*plVar13;
          }
          vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar13[1];
          *plVar13 = (long)pp_Var20;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&vtx);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar19 = (size_type *)(plVar13 + 2);
          if ((size_type *)*plVar13 == psVar19) {
            name.field_2._M_allocated_capacity = *psVar19;
            name.field_2._8_8_ = plVar13[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar19;
            name._M_dataplus._M_p = (pointer)*plVar13;
          }
          name._M_string_length = plVar13[1];
          *plVar13 = (long)psVar19;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
              (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
            operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream,
                            vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
          }
          if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
              (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
            operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream,
                            frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
            operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                            vertTemplate.m_template.field_2._M_allocated_capacity + 1);
          }
          if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
              &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)params._M_t._M_impl._0_8_,
                            (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                           _M_parent)->_M_color + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
            operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                            fragTemplate.m_template.field_2._M_allocated_capacity + 1);
          }
          params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
          ;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&params,"Varying array with ","");
          plVar13 = (long *)std::__cxx11::string::append((char *)&params);
          vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
          psVar19 = (size_type *)(plVar13 + 2);
          if ((size_type *)*plVar13 == psVar19) {
            vertTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
            vertTemplate.m_template.field_2._8_8_ = plVar13[3];
          }
          else {
            vertTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
            vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar13;
          }
          vertTemplate.m_template._M_string_length = plVar13[1];
          *plVar13 = (long)psVar19;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
          frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
          pp_Var20 = (_func_int **)(plVar13 + 2);
          if ((_func_int **)*plVar13 == pp_Var20) {
            frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
            frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar13[3];
          }
          else {
            frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
            frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)*plVar13;
          }
          frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar13[1];
          *plVar13 = (long)pp_Var20;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&frag);
          vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
          pp_Var20 = (_func_int **)(plVar13 + 2);
          if ((_func_int **)*plVar13 == pp_Var20) {
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar13[3];
          }
          else {
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)*plVar13;
          }
          vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar13[1];
          *plVar13 = (long)pp_Var20;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&vtx);
          desc._M_dataplus._M_p = (pointer)&desc.field_2;
          psVar19 = (size_type *)(plVar13 + 2);
          if ((size_type *)*plVar13 == psVar19) {
            desc.field_2._M_allocated_capacity = *psVar19;
            desc.field_2._8_8_ = plVar13[3];
          }
          else {
            desc.field_2._M_allocated_capacity = *psVar19;
            desc._M_dataplus._M_p = (pointer)*plVar13;
          }
          desc._M_string_length = plVar13[1];
          *plVar13 = (long)psVar19;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
              (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
            operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream,
                            vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
          }
          if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
              (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
            operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream,
                            frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
            operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                            vertTemplate.m_template.field_2._M_allocated_capacity + 1);
          }
          if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
              &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)params._M_t._M_impl._0_8_,
                            (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                           _M_parent)->_M_color + 1));
          }
          _Var8._M_p = name._M_dataplus._M_p;
          _Var7._M_p = desc._M_dataplus._M_p;
          local_3d8 = (this->super_TestCaseGroup).m_context;
          GVar2 = this->m_glslVersion;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
          pcVar12 = glu::getGLSLVersionDeclaration(GVar2);
          if (pcVar12 == (char *)0x0) {
            std::ios::clear((int)&vertTemplate +
                            (int)vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream[-3] + 0x1a8);
          }
          else {
            sVar14 = strlen(pcVar12);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12,sVar14);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                     "in highp vec4 a_position;\n",0x1a);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                     "in highp vec4 a_coords;\n",0x18);
          if (local_388 == 3) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar27,lVar26);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                     "out ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n",0x30);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                     "    gl_Position = a_position;\n",0x1e);
          if (lVar21 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "    var[0] = ${VAR_TYPE}(a_coords);\n",0x24);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "    var[1] = ${VAR_TYPE}(a_coords) * 0.5;\n",0x2a);
            lVar33 = 0x2c;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "    var[2] = ${VAR_TYPE}(a_coords) * 0.25;\n",0x2b);
            pcVar12 = "    var[3] = ${VAR_TYPE}(a_coords) * 0.125;\n";
          }
          else if (lVar21 == 1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "    var[ui_zero]  = ${VAR_TYPE}(a_coords);\n",0x2b);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "    var[ui_one]   = ${VAR_TYPE}(a_coords) * 0.5;\n",0x31);
            lVar33 = 0x33;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "    var[ui_two]   = ${VAR_TYPE}(a_coords) * 0.25;\n",0x32);
            pcVar12 = "    var[ui_three] = ${VAR_TYPE}(a_coords) * 0.125;\n";
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "    ${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n",0x3d);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar25,lVar24);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"    {\n",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "        var[i] = ${VAR_TYPE}(coords);\n",0x26);
            lVar33 = 6;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "        coords = coords * 0.5;\n",0x1f);
            pcVar12 = "    }\n";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12,lVar33);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
          pcVar12 = glu::getGLSLVersionDeclaration(GVar2);
          if (pcVar12 == (char *)0x0) {
            std::ios::clear((int)&vertTemplate +
                            (int)frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream[-3] + 800);
          }
          else {
            sVar14 = strlen(pcVar12);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12,sVar14);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                     "precision mediump int;\n",0x17);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                     "layout(location = 0) out mediump vec4 o_color;\n",0x2f);
          lVar33 = 0x37;
          pcVar12 = "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n";
          if (lVar29 == 1) {
LAB_00d90b5e:
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12,lVar33);
          }
          else {
            lVar33 = 0x15;
            pcVar12 = "uniform int ui_four;\n";
            if (lVar29 == 3) goto LAB_00d90b5e;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                     "in ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n",0x2f);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                     "   ${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n",0x34);
          if (lVar29 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                       "   res += var[0];\n",0x12);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                       "   res += var[1];\n",0x12);
            lVar33 = 0x12;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                       "   res += var[2];\n",0x12);
            pcVar12 = "   res += var[3];\n";
          }
          else if (lVar29 == 1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                       "   res += var[ui_zero];\n",0x18);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                       "   res += var[ui_one];\n",0x17);
            lVar33 = 0x19;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                       "   res += var[ui_two];\n",0x17);
            pcVar12 = "   res += var[ui_three];\n";
          }
          else {
            pcVar12 = "    for (int i = 0; i < ui_four; i++)\n";
            if (lVar29 == 2) {
              pcVar12 = "    for (int i = 0; i < 4; i++)\n";
            }
            lVar28 = 0x25;
            if (lVar29 == 2) {
              lVar28 = 0x1f;
            }
            lVar33 = 0x16;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12 + 1,lVar28);
            pcVar12 = "       res += var[i];\n";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12,lVar33);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                     "   o_color = vec4(res${PADDING});\n",0x22);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
          params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &params._M_t._M_impl.super__Rb_tree_header._M_header;
          params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[9],_const_char_*,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [9])0x1b7e3e9,(char **)&fragTemplate);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_p != &local_498) {
            operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
            operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                            vertTemplate.m_template.field_2._M_allocated_capacity + 1);
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x1bbe6fb);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_p != &local_498) {
            operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
            operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                            vertTemplate.m_template.field_2._M_allocated_capacity + 1);
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [10])0x1cb041f,(char (*) [8])0x1bbd4ed);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_p != &local_498) {
            operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
            operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                            vertTemplate.m_template.field_2._M_allocated_capacity + 1);
          }
          if (DVar1 == TYPE_FLOAT_VEC3) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x1b7b051);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
          }
          else if (DVar1 == TYPE_FLOAT_VEC2) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x1b7b04c);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
          }
          else if (DVar1 == TYPE_FLOAT) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])", 0.0, 0.0, 1.0");
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
          }
          else {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [8])"PADDING",
                       (char (*) [1])(glcts::fixed_sample_locations_values + 1));
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_p != &local_498) {
            operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
            operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                            vertTemplate.m_template.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                     (allocator<char> *)&local_3f8);
          tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
            operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                            fragTemplate.m_template.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
            operator_delete(vertexShaderSource._M_dataplus._M_p,
                            vertexShaderSource.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertexShaderSource,local_3f8._M_dataplus._M_p,&local_459);
          tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
            operator_delete(vertexShaderSource._M_dataplus._M_p,
                            vertexShaderSource.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
          }
          tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
          tcu::StringTemplate::specialize(&local_3f8,&fragTemplate,&params);
          if (DVar1 - TYPE_FLOAT < 4) {
            p_Var31 = (ShaderEvalFunc)(&PTR_evalArrayCoordsFloat_0210afb0)[DVar1 - TYPE_FLOAT];
          }
          else {
            p_Var31 = (ShaderEvalFunc)0x0;
          }
          pSVar15 = (ShaderIndexingCase *)operator_new(0x130);
          ShaderIndexingCase::ShaderIndexingCase
                    (pSVar15,local_3d8,_Var8._M_p,_Var7._M_p,true,DVar1,p_Var31,
                     vertexShaderSource._M_dataplus._M_p,local_3f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
            operator_delete(vertexShaderSource._M_dataplus._M_p,
                            vertexShaderSource.field_2._M_allocated_capacity + 1);
          }
          tcu::StringTemplate::~StringTemplate(&fragTemplate);
          tcu::StringTemplate::~StringTemplate(&vertTemplate);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&params._M_t);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
          std::ios_base::~ios_base
                    ((ios_base *)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70
                    );
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
          std::ios_base::~ios_base
                    ((ios_base *)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70)
          ;
          tcu::TestNode::addChild(pTVar11,(TestNode *)pSVar15);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)desc._M_dataplus._M_p != &desc.field_2) {
            operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
        }
        lVar29 = lVar29 + 1;
      } while (lVar29 != 4);
      lVar21 = lVar21 + 1;
    } while (lVar21 != 4);
    lVar22 = lVar22 + 1;
    if (lVar22 == 4) {
      pTVar11 = (TestNode *)operator_new(0x78);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,pCVar3->m_testCtx,"uniform_array",
                 "Uniform array access tests.");
      pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_0210b040;
      pTVar11[1]._vptr_TestNode = (_func_int **)pCVar3;
      tcu::TestNode::addChild((TestNode *)this,pTVar11);
      lVar22 = 0;
      do {
        DVar1 = deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes[lVar22];
        lVar21 = 0;
        do {
          pcVar25 = "    for (int i = 0; i < ui_four; i++)\n";
          if (lVar21 == 2) {
            pcVar25 = "    for (int i = 0; i < 4; i++)\n";
          }
          lVar24 = 0x23;
          if (lVar21 == 2) {
            lVar24 = 0x1d;
          }
          lVar26 = 0x1d;
          if (lVar21 == 1) {
            lVar26 = 0x37;
          }
          pcVar27 = "uniform mediump int ui_four;\n";
          if (lVar21 == 1) {
            pcVar27 = "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n";
          }
          bVar34 = true;
          local_350 = (uint)lVar21 | 2;
          lVar29 = 0;
          do {
            glu::getShaderTypeName
                      (deqp::gles2::Functional::UniformCase::randomFeatures(unsigned_int)::
                       arrayUsageChoices[lVar29]);
            pcVar12 = glu::getDataTypeName(DVar1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&params,pcVar12,(allocator<char> *)&fragTemplate);
            plVar13 = (long *)std::__cxx11::string::append((char *)&params);
            vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
            psVar19 = (size_type *)(plVar13 + 2);
            if ((size_type *)*plVar13 == psVar19) {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
              vertTemplate.m_template.field_2._8_8_ = plVar13[3];
            }
            else {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
              vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar13;
            }
            vertTemplate.m_template._M_string_length = plVar13[1];
            *plVar13 = (long)psVar19;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            plVar13 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
            frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
            pp_Var20 = (_func_int **)(plVar13 + 2);
            if ((_func_int **)*plVar13 == pp_Var20) {
              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
              frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar13[3];
            }
            else {
              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)*plVar13;
            }
            frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar13[1];
            *plVar13 = (long)pp_Var20;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            plVar13 = (long *)std::__cxx11::string::append((char *)&frag);
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
            pp_Var20 = (_func_int **)(plVar13 + 2);
            if ((_func_int **)*plVar13 == pp_Var20) {
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar13[3];
            }
            else {
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)*plVar13;
            }
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar13[1];
            *plVar13 = (long)pp_Var20;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            plVar13 = (long *)std::__cxx11::string::append((char *)&vtx);
            name._M_dataplus._M_p = (pointer)&name.field_2;
            psVar19 = (size_type *)(plVar13 + 2);
            if ((size_type *)*plVar13 == psVar19) {
              name.field_2._M_allocated_capacity = *psVar19;
              name.field_2._8_8_ = plVar13[3];
            }
            else {
              name.field_2._M_allocated_capacity = *psVar19;
              name._M_dataplus._M_p = (pointer)*plVar13;
            }
            name._M_string_length = plVar13[1];
            *plVar13 = (long)psVar19;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
              operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
              operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            params._M_t._M_impl._0_8_ =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&params,"Uniform array with ","");
            plVar13 = (long *)std::__cxx11::string::append((char *)&params);
            vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
            psVar19 = (size_type *)(plVar13 + 2);
            if ((size_type *)*plVar13 == psVar19) {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
              vertTemplate.m_template.field_2._8_8_ = plVar13[3];
            }
            else {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
              vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar13;
            }
            vertTemplate.m_template._M_string_length = plVar13[1];
            *plVar13 = (long)psVar19;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            plVar13 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
            frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
            pp_Var20 = (_func_int **)(plVar13 + 2);
            if ((_func_int **)*plVar13 == pp_Var20) {
              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
              frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar13[3];
            }
            else {
              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)*plVar13;
            }
            frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar13[1];
            *plVar13 = (long)pp_Var20;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            plVar13 = (long *)std::__cxx11::string::append((char *)&frag);
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
            pp_Var20 = (_func_int **)(plVar13 + 2);
            if ((_func_int **)*plVar13 == pp_Var20) {
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar13[3];
            }
            else {
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)*plVar13;
            }
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar13[1];
            *plVar13 = (long)pp_Var20;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            plVar13 = (long *)std::__cxx11::string::append((char *)&vtx);
            desc._M_dataplus._M_p = (pointer)&desc.field_2;
            psVar19 = (size_type *)(plVar13 + 2);
            if ((size_type *)*plVar13 == psVar19) {
              desc.field_2._M_allocated_capacity = *psVar19;
              desc.field_2._8_8_ = plVar13[3];
            }
            else {
              desc.field_2._M_allocated_capacity = *psVar19;
              desc._M_dataplus._M_p = (pointer)*plVar13;
            }
            desc._M_string_length = plVar13[1];
            *plVar13 = (long)psVar19;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
              operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
              operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            _Var7._M_p = name._M_dataplus._M_p;
            pCVar3 = (this->super_TestCaseGroup).m_context;
            local_3d8 = (Context *)desc._M_dataplus._M_p;
            GVar2 = this->m_glslVersion;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
            poVar30 = (ostringstream *)&frag;
            if (bVar34) {
              poVar30 = (ostringstream *)&vtx;
            }
            pcVar12 = glu::getGLSLVersionDeclaration(GVar2);
            if (pcVar12 == (char *)0x0) {
              std::ios::clear((int)&vertTemplate +
                              (int)vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream[-3] + 0x1a8);
            }
            else {
              sVar14 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12,sVar14);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
            pcVar12 = glu::getGLSLVersionDeclaration(GVar2);
            if (pcVar12 == (char *)0x0) {
              std::ios::clear((int)&vertTemplate +
                              (int)frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream[-3] + 800);
            }
            else {
              sVar14 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12,sVar14);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "in highp vec4 a_position;\n",0x1a);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "in highp vec4 a_coords;\n",0x18);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                       "layout(location = 0) out mediump vec4 o_color;\n",0x2f);
            if (bVar34 == false) {
              lVar29 = 0x1a;
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "out mediump vec4 v_coords;\n",0x1b);
              pcVar12 = "in mediump vec4 v_coords;\n";
            }
            else {
              lVar29 = 0x19;
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "out mediump vec4 v_color;\n",0x1a);
              pcVar12 = "in mediump vec4 v_color;\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12,lVar29);
            if (local_350 == 3) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar30,pcVar27,lVar26);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar30,"uniform ${PRECISION} ${VAR_TYPE} u_arr[${ARRAY_LEN}];\n",
                       0x36);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "    gl_Position = a_position;\n",0x1e);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar30," ${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n",0x32
                      );
            if (lVar21 == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar30," res += u_arr[0];\n",0x12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar30," res += u_arr[1];\n",0x12);
              lVar29 = 0x12;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar30," res += u_arr[2];\n",0x12);
              pcVar12 = " res += u_arr[3];\n";
            }
            else if (lVar21 == 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar30," res += u_arr[ui_zero];\n",0x18);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar30," res += u_arr[ui_one];\n",0x17);
              lVar29 = 0x19;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar30," res += u_arr[ui_two];\n",0x17);
              pcVar12 = " res += u_arr[ui_three];\n";
            }
            else {
              lVar29 = 0x16;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar30,pcVar25 + 3,lVar24);
              pcVar12 = "     res += u_arr[i];\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar30,pcVar12,lVar29);
            if (bVar34 == false) {
              lVar29 = 0x22;
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "    v_coords = a_coords;\n",0x19);
              pcVar12 = "   o_color = vec4(res${PADDING});\n";
            }
            else {
              lVar29 = 0x16;
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "    v_color = vec4(res${PADDING});\n",0x23);
              pcVar12 = "   o_color = v_color;\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12,lVar29);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
            params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header;
            params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[9],_const_char_*,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [9])0x1b7e3e9,(char **)&fragTemplate);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_p != &local_498) {
              operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x1bbe6fb);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_p != &local_498) {
              operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [10])0x1cb041f,(char (*) [8])0x1bbd4ed);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_p != &local_498) {
              operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            if (DVar1 == TYPE_FLOAT_VEC3) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x1b7b051);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
            }
            else if (DVar1 == TYPE_FLOAT_VEC2) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x1b7b04c);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
            }
            else if (DVar1 == TYPE_FLOAT) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])", 0.0, 0.0, 1.0");
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
            }
            else {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])"PADDING",
                         (char (*) [1])(glcts::fixed_sample_locations_values + 1));
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_p != &local_498) {
              operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                       (allocator<char> *)&local_3f8);
            tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
              operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                              fragTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
              operator_delete(vertexShaderSource._M_dataplus._M_p,
                              vertexShaderSource.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vertexShaderSource,local_3f8._M_dataplus._M_p,&local_459);
            tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
              operator_delete(vertexShaderSource._M_dataplus._M_p,
                              vertexShaderSource.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
              operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1
                             );
            }
            tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
            tcu::StringTemplate::specialize(&local_3f8,&fragTemplate,&params);
            if (DVar1 - TYPE_FLOAT < 4) {
              p_Var31 = (ShaderEvalFunc)(&PTR_evalArrayUniformFloat_0210af90)[DVar1 - TYPE_FLOAT];
            }
            else {
              p_Var31 = (ShaderEvalFunc)0x0;
            }
            pSVar15 = (ShaderIndexingCase *)operator_new(0x130);
            ShaderIndexingCase::ShaderIndexingCase
                      (pSVar15,pCVar3,_Var7._M_p,(char *)local_3d8,bVar34,DVar1,p_Var31,
                       vertexShaderSource._M_dataplus._M_p,local_3f8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
              operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
              operator_delete(vertexShaderSource._M_dataplus._M_p,
                              vertexShaderSource.field_2._M_allocated_capacity + 1);
            }
            tcu::StringTemplate::~StringTemplate(&fragTemplate);
            tcu::StringTemplate::~StringTemplate(&vertTemplate);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree(&params._M_t);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
            tcu::TestNode::addChild(pTVar11,(TestNode *)pSVar15);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)desc._M_dataplus._M_p != &desc.field_2) {
              operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != &name.field_2) {
              operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
            }
            lVar29 = 1;
            bVar35 = bVar34 != false;
            bVar34 = false;
          } while (bVar35);
          lVar21 = lVar21 + 1;
        } while (lVar21 != 4);
        lVar22 = lVar22 + 1;
      } while (lVar22 != 4);
      pTVar11 = (TestNode *)operator_new(0x78);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,pCVar3->m_testCtx,"tmp_array",
                 "Temporary array access tests.");
      pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_0210b040;
      pTVar11[1]._vptr_TestNode = (_func_int **)pCVar3;
      tcu::TestNode::addChild((TestNode *)this,pTVar11);
      lVar22 = 0;
      do {
        DVar1 = deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes[lVar22];
        bVar34 = true;
        do {
          bVar35 = bVar34;
          uVar17 = 1;
          do {
            uVar9 = 0;
            if (bVar35) {
              uVar9 = uVar17;
            }
            uVar32 = (ulong)uVar17;
            if (bVar35) {
              uVar32 = 0;
            }
            local_3d8 = (Context *)(&getIndexAccessTypeName(deqp::IndexAccessType)::s_names)[uVar32]
            ;
            iVar10 = (int)uVar32;
            pcVar27 = "    for (int i = 0; i < ui_four; i++)\n";
            pcVar25 = "    for (int i = 0; i < ui_four; i++)\n";
            if (uVar17 == 2) {
              pcVar25 = "    for (int i = 0; i < 4; i++)\n";
            }
            lVar21 = 0x23;
            if (uVar17 == 2) {
              lVar21 = 0x1d;
            }
            if (uVar9 == 2) {
              pcVar27 = "    for (int i = 0; i < 4; i++)\n";
            }
            lVar24 = 0x23;
            if (uVar9 == 2) {
              lVar24 = 0x1d;
            }
            lVar26 = 0;
            bVar34 = true;
            do {
              bVar4 = bVar34;
              glu::getShaderTypeName
                        (deqp::gles2::Functional::UniformCase::randomFeatures(unsigned_int)::
                         arrayUsageChoices[lVar26]);
              pcVar12 = glu::getDataTypeName(DVar1);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,pcVar12,(allocator<char> *)&local_3f8);
              plVar13 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar19 = (size_type *)(plVar13 + 2);
              if ((size_type *)*plVar13 == psVar19) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                fragTemplate.m_template.field_2._8_8_ = plVar13[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar13;
              }
              fragTemplate.m_template._M_string_length = plVar13[1];
              *plVar13 = (long)psVar19;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar18 = plVar13 + 2;
              if ((long *)*plVar13 == plVar18) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar18;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar13[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar18;
                params._M_t._M_impl._0_8_ = (long *)*plVar13;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar13[1];
              *plVar13 = (long)plVar18;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar19 = (size_type *)(plVar13 + 2);
              if ((size_type *)*plVar13 == psVar19) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                vertTemplate.m_template.field_2._8_8_ = plVar13[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar13;
              }
              vertTemplate.m_template._M_string_length = plVar13[1];
              *plVar13 = (long)psVar19;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10
              ;
              pp_Var20 = (_func_int **)(plVar13 + 2);
              if ((_func_int **)*plVar13 == pp_Var20) {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar13[3];
              }
              else {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar13;
              }
              frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar13[1];
              *plVar13 = (long)pp_Var20;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&frag);
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              pp_Var20 = (_func_int **)(plVar13 + 2);
              if ((_func_int **)*plVar13 == pp_Var20) {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar13[3];
              }
              else {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar13;
              }
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar13[1];
              *plVar13 = (long)pp_Var20;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&vtx);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar19 = (size_type *)(plVar13 + 2);
              if ((size_type *)*plVar13 == psVar19) {
                name.field_2._M_allocated_capacity = *psVar19;
                name.field_2._8_8_ = plVar13[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar19;
                name._M_dataplus._M_p = (pointer)*plVar13;
              }
              name._M_string_length = plVar13[1];
              *plVar13 = (long)psVar19;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&vertexShaderSource,"Temporary array with ","");
              plVar13 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar19 = (size_type *)(plVar13 + 2);
              if ((size_type *)*plVar13 == psVar19) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                fragTemplate.m_template.field_2._8_8_ = plVar13[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar13;
              }
              fragTemplate.m_template._M_string_length = plVar13[1];
              *plVar13 = (long)psVar19;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar18 = plVar13 + 2;
              if ((long *)*plVar13 == plVar18) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar18;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar13[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar18;
                params._M_t._M_impl._0_8_ = (long *)*plVar13;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar13[1];
              *plVar13 = (long)plVar18;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar19 = (size_type *)(plVar13 + 2);
              if ((size_type *)*plVar13 == psVar19) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                vertTemplate.m_template.field_2._8_8_ = plVar13[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar13;
              }
              vertTemplate.m_template._M_string_length = plVar13[1];
              *plVar13 = (long)psVar19;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10
              ;
              pp_Var20 = (_func_int **)(plVar13 + 2);
              if ((_func_int **)*plVar13 == pp_Var20) {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar13[3];
              }
              else {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar13;
              }
              frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar13[1];
              *plVar13 = (long)pp_Var20;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&frag);
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              pp_Var20 = (_func_int **)(plVar13 + 2);
              if ((_func_int **)*plVar13 == pp_Var20) {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar13[3];
              }
              else {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar13;
              }
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar13[1];
              *plVar13 = (long)pp_Var20;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&vtx);
              desc._M_dataplus._M_p = (pointer)&desc.field_2;
              psVar19 = (size_type *)(plVar13 + 2);
              if ((size_type *)*plVar13 == psVar19) {
                desc.field_2._M_allocated_capacity = *psVar19;
                desc.field_2._8_8_ = plVar13[3];
              }
              else {
                desc.field_2._M_allocated_capacity = *psVar19;
                desc._M_dataplus._M_p = (pointer)*plVar13;
              }
              desc._M_string_length = plVar13[1];
              *plVar13 = (long)psVar19;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              _Var8._M_p = name._M_dataplus._M_p;
              _Var7._M_p = desc._M_dataplus._M_p;
              pCVar3 = (this->super_TestCaseGroup).m_context;
              GVar2 = this->m_glslVersion;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
              poVar30 = (ostringstream *)&frag;
              if (bVar4) {
                poVar30 = (ostringstream *)&vtx;
              }
              pcVar12 = glu::getGLSLVersionDeclaration(GVar2);
              if (pcVar12 == (char *)0x0) {
                std::ios::clear((int)&vertTemplate +
                                (int)vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                     _vptr_basic_ostream[-3] + 0x1a8);
              }
              else {
                sVar14 = strlen(pcVar12);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12,sVar14);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              pcVar12 = glu::getGLSLVersionDeclaration(GVar2);
              if (pcVar12 == (char *)0x0) {
                std::ios::clear((int)&vertTemplate +
                                (int)frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                     _vptr_basic_ostream[-3] + 800);
              }
              else {
                sVar14 = strlen(pcVar12);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12,sVar14);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "in highp vec4 a_position;\n",0x1a);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "in highp vec4 a_coords;\n",0x18);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                         "layout(location = 0) out mediump vec4 o_color;\n",0x2f);
              if (bVar4) {
                lVar26 = 0x19;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "out mediump vec4 v_color;\n",0x1a);
                pcVar12 = "in mediump vec4 v_color;\n";
              }
              else {
                lVar26 = 0x1a;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "out mediump vec4 v_coords;\n",0x1b);
                pcVar12 = "in mediump vec4 v_coords;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12,lVar26);
              if (uVar9 == 1 || iVar10 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30,
                           "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n",0x37);
              }
              if (uVar9 == 3 || iVar10 == 3) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30,"uniform mediump int ui_four;\n",0x1d);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "    gl_Position = a_position;\n",0x1e);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",
                         0xc);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
              pcVar12 = " ${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(v_coords);\n";
              if (bVar4) {
                pcVar12 = " ${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar30,pcVar12,0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar30," ${PRECISION} ${VAR_TYPE} arr[${ARRAY_LEN}];\n",0x2d);
              if (bVar35) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30," arr[0] = ${VAR_TYPE}(coords);\n",0x1f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30," arr[1] = ${VAR_TYPE}(coords) * 0.5;\n",0x25);
                lVar26 = 0x27;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30," arr[2] = ${VAR_TYPE}(coords) * 0.25;\n",0x26);
                pcVar12 = " arr[3] = ${VAR_TYPE}(coords) * 0.125;\n";
              }
              else if (iVar10 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30," arr[ui_zero]  = ${VAR_TYPE}(coords);\n",0x26);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30," arr[ui_one]   = ${VAR_TYPE}(coords) * 0.5;\n",0x2c);
                lVar26 = 0x2e;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30," arr[ui_two]   = ${VAR_TYPE}(coords) * 0.25;\n",0x2d)
                ;
                pcVar12 = " arr[ui_three] = ${VAR_TYPE}(coords) * 0.125;\n";
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30,pcVar25 + 3,lVar21);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar30," {\n",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30,"     arr[i] = ${VAR_TYPE}(coords);\n",0x23);
                lVar26 = 3;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30,"     coords = coords * 0.5;\n",0x1c);
                pcVar12 = " }\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar30,pcVar12,lVar26);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar30," ${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n",
                         0x32);
              if (bVar35) {
                if (uVar9 == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30," res += arr[ui_zero];\n",0x16);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30," res += arr[ui_one];\n",0x15);
                  lVar26 = 0x17;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30," res += arr[ui_two];\n",0x15);
                  pcVar12 = " res += arr[ui_three];\n";
                }
                else {
                  lVar26 = 0x14;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30,pcVar27 + 3,lVar24);
                  pcVar12 = "     res += arr[i];\n";
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30," res += arr[0];\n",0x10);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30," res += arr[1];\n",0x10);
                lVar26 = 0x10;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30," res += arr[2];\n",0x10);
                pcVar12 = " res += arr[3];\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar30,pcVar12,lVar26);
              if (bVar4) {
                lVar26 = 0x16;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "    v_color = vec4(res${PADDING});\n",0x23);
                pcVar12 = "   o_color = v_color;\n";
              }
              else {
                lVar26 = 0x22;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "    v_coords = a_coords;\n",0x19);
                pcVar12 = "   o_color = vec4(res${PADDING});\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12,lVar26);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header;
              params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])0x1b7e3e9,(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x1bbe6fb);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])0x1cb041f,(char (*) [8])0x1bbd4ed);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if (DVar1 == TYPE_FLOAT_VEC3) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x1b7b051);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else if (DVar1 == TYPE_FLOAT_VEC2) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x1b7b04c);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else if (DVar1 == TYPE_FLOAT) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])", 0.0, 0.0, 1.0"
                          );
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",
                           (char (*) [1])(glcts::fixed_sample_locations_values + 1));
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                         (allocator<char> *)&local_3f8);
              tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,local_3f8._M_dataplus._M_p,&local_459);
              tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                local_3f8.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
              tcu::StringTemplate::specialize(&local_3f8,&fragTemplate,&params);
              if (DVar1 - TYPE_FLOAT < 4) {
                p_Var31 = (ShaderEvalFunc)(&PTR_evalArrayCoordsFloat_0210afb0)[DVar1 - TYPE_FLOAT];
              }
              else {
                p_Var31 = (ShaderEvalFunc)0x0;
              }
              pSVar15 = (ShaderIndexingCase *)operator_new(0x130);
              ShaderIndexingCase::ShaderIndexingCase
                        (pSVar15,pCVar3,_Var8._M_p,_Var7._M_p,bVar4,DVar1,p_Var31,
                         vertexShaderSource._M_dataplus._M_p,local_3f8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                local_3f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::~StringTemplate(&fragTemplate);
              tcu::StringTemplate::~StringTemplate(&vertTemplate);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&params._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
              tcu::TestNode::addChild(pTVar11,(TestNode *)pSVar15);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)desc._M_dataplus._M_p != &desc.field_2) {
                operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
              lVar26 = 1;
              bVar34 = false;
            } while (bVar4);
            uVar17 = uVar17 + 1;
          } while (uVar17 != 4);
          bVar34 = false;
        } while (bVar35);
        lVar22 = lVar22 + 1;
      } while (lVar22 != 4);
      pTVar11 = (TestNode *)operator_new(0x78);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,pCVar3->m_testCtx,"vector_subscript",
                 "Vector subscript indexing.");
      pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_0210b040;
      pTVar11[1]._vptr_TestNode = (_func_int **)pCVar3;
      tcu::TestNode::addChild((TestNode *)this,pTVar11);
      lVar22 = 0;
      do {
        DVar1 = init::s_vectorTypes[lVar22];
        bVar34 = true;
        do {
          bVar35 = bVar34;
          uVar17 = 2;
          do {
            uVar32 = 0;
            uVar9 = uVar17;
            if (bVar35) {
              uVar32 = (ulong)uVar17;
              uVar9 = 0;
            }
            local_3d8 = (Context *)
                        (&getVectorAccessTypeName(deqp::VectorAccessType)::s_names)[uVar32];
            iVar10 = (int)uVar32;
            lVar21 = 0;
            bVar34 = true;
            do {
              bVar4 = bVar34;
              glu::getShaderTypeName
                        (deqp::gles2::Functional::UniformCase::randomFeatures(unsigned_int)::
                         arrayUsageChoices[lVar21]);
              pcVar25 = glu::getDataTypeName(DVar1);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,pcVar25,(allocator<char> *)&local_3f8);
              plVar13 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar19 = (size_type *)(plVar13 + 2);
              if ((size_type *)*plVar13 == psVar19) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                fragTemplate.m_template.field_2._8_8_ = plVar13[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar13;
              }
              fragTemplate.m_template._M_string_length = plVar13[1];
              *plVar13 = (long)psVar19;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar18 = plVar13 + 2;
              if ((long *)*plVar13 == plVar18) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar18;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar13[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar18;
                params._M_t._M_impl._0_8_ = (long *)*plVar13;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar13[1];
              *plVar13 = (long)plVar18;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar19 = (size_type *)(plVar13 + 2);
              if ((size_type *)*plVar13 == psVar19) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                vertTemplate.m_template.field_2._8_8_ = plVar13[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar13;
              }
              vertTemplate.m_template._M_string_length = plVar13[1];
              *plVar13 = (long)psVar19;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10
              ;
              pp_Var20 = (_func_int **)(plVar13 + 2);
              if ((_func_int **)*plVar13 == pp_Var20) {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar13[3];
              }
              else {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar13;
              }
              frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar13[1];
              *plVar13 = (long)pp_Var20;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&frag);
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              pp_Var20 = (_func_int **)(plVar13 + 2);
              if ((_func_int **)*plVar13 == pp_Var20) {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar13[3];
              }
              else {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar13;
              }
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar13[1];
              *plVar13 = (long)pp_Var20;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&vtx);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar19 = (size_type *)(plVar13 + 2);
              if ((size_type *)*plVar13 == psVar19) {
                name.field_2._M_allocated_capacity = *psVar19;
                name.field_2._8_8_ = plVar13[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar19;
                name._M_dataplus._M_p = (pointer)*plVar13;
              }
              name._M_string_length = plVar13[1];
              *plVar13 = (long)psVar19;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&vertexShaderSource,"Vector subscript access with ","");
              plVar13 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar19 = (size_type *)(plVar13 + 2);
              if ((size_type *)*plVar13 == psVar19) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                fragTemplate.m_template.field_2._8_8_ = plVar13[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar13;
              }
              fragTemplate.m_template._M_string_length = plVar13[1];
              *plVar13 = (long)psVar19;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar18 = plVar13 + 2;
              if ((long *)*plVar13 == plVar18) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar18;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar13[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar18;
                params._M_t._M_impl._0_8_ = (long *)*plVar13;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar13[1];
              *plVar13 = (long)plVar18;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar19 = (size_type *)(plVar13 + 2);
              if ((size_type *)*plVar13 == psVar19) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                vertTemplate.m_template.field_2._8_8_ = plVar13[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar13;
              }
              vertTemplate.m_template._M_string_length = plVar13[1];
              *plVar13 = (long)psVar19;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10
              ;
              pp_Var20 = (_func_int **)(plVar13 + 2);
              if ((_func_int **)*plVar13 == pp_Var20) {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar13[3];
              }
              else {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar13;
              }
              frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar13[1];
              *plVar13 = (long)pp_Var20;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&frag);
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              pp_Var20 = (_func_int **)(plVar13 + 2);
              if ((_func_int **)*plVar13 == pp_Var20) {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar13[3];
              }
              else {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar13;
              }
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar13[1];
              *plVar13 = (long)pp_Var20;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&vtx);
              desc._M_dataplus._M_p = (pointer)&desc.field_2;
              psVar19 = (size_type *)(plVar13 + 2);
              if ((size_type *)*plVar13 == psVar19) {
                desc.field_2._M_allocated_capacity = *psVar19;
                desc.field_2._8_8_ = plVar13[3];
              }
              else {
                desc.field_2._M_allocated_capacity = *psVar19;
                desc._M_dataplus._M_p = (pointer)*plVar13;
              }
              desc._M_string_length = plVar13[1];
              *plVar13 = (long)psVar19;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              _Var8._M_p = name._M_dataplus._M_p;
              _Var7._M_p = desc._M_dataplus._M_p;
              pCVar3 = (this->super_TestCaseGroup).m_context;
              GVar2 = this->m_glslVersion;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
              poVar30 = (ostringstream *)&frag;
              if (bVar4) {
                poVar30 = (ostringstream *)&vtx;
              }
              number = glu::getDataTypeScalarSize(DVar1);
              pcVar25 = getIntUniformName(number);
              pcVar27 = glu::getGLSLVersionDeclaration(GVar2);
              if (pcVar27 == (char *)0x0) {
                std::ios::clear((int)&vertTemplate +
                                (int)vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                     _vptr_basic_ostream[-3] + 0x1a8);
              }
              else {
                sVar14 = strlen(pcVar27);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar27,sVar14);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              pcVar27 = glu::getGLSLVersionDeclaration(GVar2);
              if (pcVar27 == (char *)0x0) {
                std::ios::clear((int)&vertTemplate +
                                (int)frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                     _vptr_basic_ostream[-3] + 800);
              }
              else {
                sVar14 = strlen(pcVar27);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar27,sVar14);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "in highp vec4 a_position;\n",0x1a);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "in highp vec4 a_coords;\n",0x18);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                         "layout(location = 0) out mediump vec4 o_color;\n",0x2f);
              if (bVar4) {
                lVar21 = 0x19;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "out mediump vec3 v_color;\n",0x1a);
                pcVar27 = "in mediump vec3 v_color;\n";
              }
              else {
                lVar21 = 0x1a;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "out mediump vec4 v_coords;\n",0x1b);
                pcVar27 = "in mediump vec4 v_coords;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar27,lVar21);
              if (iVar10 == 3 || uVar9 == 3) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30,"uniform mediump int ui_zero",0x1b);
                if (((1 < (int)number) &&
                    (std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)poVar30,", ui_one",8), number != 2)) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar30,", ui_two",8), 3 < number)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30,", ui_three",10);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar30,";\n",2);
              }
              iVar5 = (int)poVar30;
              if (iVar10 == 5 || uVar9 == 5) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30,"uniform mediump int ",0x14);
                if (pcVar25 == (char *)0x0) {
                  std::ios::clear(iVar5 + (int)*(undefined8 *)(*(long *)poVar30 + -0x18));
                }
                else {
                  sVar14 = strlen(pcVar25);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30,pcVar25,sVar14);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar30,";\n",2);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "    gl_Position = a_position;\n",0x1e);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",
                         0xc);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
              pcVar27 = " ${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(v_coords);\n";
              if (bVar4) {
                pcVar27 = " ${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar30,pcVar27,0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar30," ${PRECISION} ${VAR_TYPE} tmp;\n",0x1f);
              if (uVar9 == 0) {
                lVar21 = 0x43;
                pcVar27 = " tmp = coords.${SWIZZLE} * vec4(1.0, 0.5, 0.25, 0.125).${SWIZZLE};\n";
LAB_00d9414d:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30,pcVar27,lVar21);
              }
              else if (uVar9 == 2) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30," tmp[0] = coords.x;\n",0x14);
                if ((1 < (int)number) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar30,"    tmp[1] = coords.y * 0.5;\n",0x1d),
                   number != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30,"    tmp[2] = coords.z * 0.25;\n",0x1e);
                  lVar21 = 0x1f;
                  pcVar27 = "    tmp[3] = coords.w * 0.125;\n";
LAB_00d9406f:
                  if (3 < number) goto LAB_00d9414d;
                }
              }
              else if (uVar9 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30," tmp.x = coords.x;\n",0x13);
                if ((1 < (int)number) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar30,"    tmp.y = coords.y * 0.5;\n",0x1c), number != 2
                   )) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30,"    tmp.z = coords.z * 0.25;\n",0x1d);
                  lVar21 = 0x1e;
                  pcVar27 = "    tmp.w = coords.w * 0.125;\n";
                  goto LAB_00d9406f;
                }
              }
              else {
                if (uVar9 != 3) {
                  if (uVar9 == 4) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar30," for (int i = 0; i < ",0x15);
                    poVar16 = (ostringstream *)std::ostream::operator<<(poVar30,number);
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar30," for (int i = 0; i < ",0x15);
                    poVar16 = poVar30;
                    if (pcVar25 == (char *)0x0) {
                      std::ios::clear(iVar5 + (int)*(undefined8 *)(*(long *)poVar30 + -0x18));
                    }
                    else {
                      sVar14 = strlen(pcVar25);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar30,pcVar25,sVar14);
                    }
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar16,"; i++)\n",7);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar30," {\n",3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30,"     tmp[i] = coords.x;\n",0x18);
                  lVar21 = 3;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30,"     coords = coords.${ROT_SWIZZLE} * 0.5;\n",0x2b)
                  ;
                  pcVar27 = " }\n";
                  goto LAB_00d9414d;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30," tmp[ui_zero]  = coords.x;\n",0x1b);
                if ((1 < (int)number) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar30,"    tmp[ui_one]   = coords.y * 0.5;\n",0x24),
                   number != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30,"    tmp[ui_two]   = coords.z * 0.25;\n",0x25);
                  lVar21 = 0x26;
                  pcVar27 = "    tmp[ui_three] = coords.w * 0.125;\n";
                  goto LAB_00d9406f;
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar30," ${PRECISION} float res = 0.0;\n",0x1f);
              if (iVar10 == 0) {
                lVar21 = 0x23;
                pcVar25 = " res = dot(tmp, ${VAR_TYPE}(1.0));\n";
LAB_00d9435c:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30,pcVar25,lVar21);
              }
              else if (iVar10 == 2) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30," res += tmp[0];\n",0x10);
                if ((1 < (int)number) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar30,"    res += tmp[1];\n",0x13), number != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30,"    res += tmp[2];\n",0x13);
                  lVar21 = 0x13;
                  pcVar25 = "    res += tmp[3];\n";
LAB_00d942b9:
                  if (3 < number) goto LAB_00d9435c;
                }
              }
              else if (iVar10 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30," res += tmp.x;\n",0xf);
                if ((1 < (int)number) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar30,"    res += tmp.y;\n",0x12), number != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30,"    res += tmp.z;\n",0x12);
                  lVar21 = 0x12;
                  pcVar25 = "    res += tmp.w;\n";
                  goto LAB_00d942b9;
                }
              }
              else {
                if (iVar10 != 3) {
                  if (iVar10 == 4) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar30," for (int i = 0; i < ",0x15);
                    poVar16 = (ostringstream *)std::ostream::operator<<(poVar30,number);
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar30," for (int i = 0; i < ",0x15);
                    poVar16 = poVar30;
                    if (pcVar25 == (char *)0x0) {
                      std::ios::clear(iVar5 + (int)*(undefined8 *)(*(long *)poVar30 + -0x18));
                    }
                    else {
                      sVar14 = strlen(pcVar25);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar30,pcVar25,sVar14);
                    }
                  }
                  lVar21 = 0x14;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar16,"; i++)\n",7);
                  pcVar25 = "     res += tmp[i];\n";
                  goto LAB_00d9435c;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30," res += tmp[ui_zero];\n",0x16);
                if ((1 < (int)number) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar30,"    res += tmp[ui_one];\n",0x18), number != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30,"    res += tmp[ui_two];\n",0x18);
                  lVar21 = 0x1a;
                  pcVar25 = "    res += tmp[ui_three];\n";
                  goto LAB_00d942b9;
                }
              }
              if (bVar4) {
                lVar21 = 0x25;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "    v_color = vec3(res);\n",0x19);
                pcVar25 = "   o_color = vec4(v_color.rgb, 1.0);\n";
              }
              else {
                lVar21 = 0x23;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "    v_coords = a_coords;\n",0x19);
                pcVar25 = "   o_color = vec4(vec3(res), 1.0);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar25,lVar21);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header;
              params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])0x1b7e3e9,(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])0x1cb041f,(char (*) [8])0x1bbd4ed);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_*&,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])0x1aa0bde,
                         (char **)(createVectorSubscriptCase(deqp::Context&,char_const*,char_const*,glu::GLSLVersion,bool,glu::DataType,deqp::VectorAccessType,deqp::VectorAccessType)
                                   ::s_swizzles + (long)(int)number * 8));
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[12],_const_char_*&,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [12])"ROT_SWIZZLE",
                         (char **)(createVectorSubscriptCase(deqp::Context&,char_const*,char_const*,glu::GLSLVersion,bool,glu::DataType,deqp::VectorAccessType,deqp::VectorAccessType)
                                   ::s_rotSwizzles + (long)(int)number * 8));
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                         (allocator<char> *)&local_3f8);
              tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,local_3f8._M_dataplus._M_p,&local_459);
              tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                local_3f8.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
              tcu::StringTemplate::specialize(&local_3f8,&fragTemplate,&params);
              if (DVar1 - TYPE_FLOAT_VEC2 < 3) {
                p_Var31 = (ShaderEvalFunc)(&PTR_evalSubscriptVec2_0210afd0)[DVar1 - TYPE_FLOAT_VEC2]
                ;
              }
              else {
                p_Var31 = (ShaderEvalFunc)0x0;
              }
              pSVar15 = (ShaderIndexingCase *)operator_new(0x130);
              ShaderIndexingCase::ShaderIndexingCase
                        (pSVar15,pCVar3,_Var8._M_p,_Var7._M_p,bVar4,DVar1,p_Var31,
                         vertexShaderSource._M_dataplus._M_p,local_3f8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                local_3f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::~StringTemplate(&fragTemplate);
              tcu::StringTemplate::~StringTemplate(&vertTemplate);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&params._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
              tcu::TestNode::addChild(pTVar11,(TestNode *)pSVar15);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)desc._M_dataplus._M_p != &desc.field_2) {
                operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
              lVar21 = 1;
              bVar34 = false;
            } while (bVar4);
            uVar17 = uVar17 + 1;
          } while (uVar17 != 6);
          bVar34 = false;
        } while (bVar35);
        lVar22 = lVar22 + 1;
      } while (lVar22 != 3);
      pTVar11 = (TestNode *)operator_new(0x78);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,pCVar3->m_testCtx,"matrix_subscript",
                 "Matrix subscript indexing.");
      pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_0210b040;
      pTVar11[1]._vptr_TestNode = (_func_int **)pCVar3;
      tcu::TestNode::addChild((TestNode *)this,pTVar11);
      local_330 = 0;
      do {
        DVar1 = init::s_matrixTypes[local_330];
        uVar17 = DVar1 - TYPE_FLOAT_MAT2;
        local_3d8 = (Context *)
                    CONCAT44(local_3d8._4_4_,(int)CONCAT71((uint7)(uint3)(uVar17 >> 8),1));
        do {
          iVar10 = 1;
          do {
            iVar23 = iVar10;
            iVar5 = 0;
            if (((ulong)local_3d8 & 1) != 0) {
              iVar23 = 0;
              iVar5 = iVar10;
            }
            bVar34 = true;
            lVar22 = 0;
            do {
              glu::getShaderTypeName
                        (deqp::gles2::Functional::UniformCase::randomFeatures(unsigned_int)::
                         arrayUsageChoices[lVar22]);
              pcVar25 = glu::getDataTypeName(DVar1);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,pcVar25,(allocator<char> *)&local_3f8);
              plVar13 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar19 = (size_type *)(plVar13 + 2);
              if ((size_type *)*plVar13 == psVar19) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                fragTemplate.m_template.field_2._8_8_ = plVar13[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar13;
              }
              fragTemplate.m_template._M_string_length = plVar13[1];
              *plVar13 = (long)psVar19;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar18 = plVar13 + 2;
              if ((long *)*plVar13 == plVar18) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar18;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar13[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar18;
                params._M_t._M_impl._0_8_ = (long *)*plVar13;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar13[1];
              *plVar13 = (long)plVar18;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar19 = (size_type *)(plVar13 + 2);
              if ((size_type *)*plVar13 == psVar19) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                vertTemplate.m_template.field_2._8_8_ = plVar13[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar13;
              }
              vertTemplate.m_template._M_string_length = plVar13[1];
              *plVar13 = (long)psVar19;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10
              ;
              pp_Var20 = (_func_int **)(plVar13 + 2);
              if ((_func_int **)*plVar13 == pp_Var20) {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar13[3];
              }
              else {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar13;
              }
              frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar13[1];
              *plVar13 = (long)pp_Var20;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&frag);
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              pp_Var20 = (_func_int **)(plVar13 + 2);
              if ((_func_int **)*plVar13 == pp_Var20) {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar13[3];
              }
              else {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar13;
              }
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar13[1];
              *plVar13 = (long)pp_Var20;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&vtx);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar19 = (size_type *)(plVar13 + 2);
              if ((size_type *)*plVar13 == psVar19) {
                name.field_2._M_allocated_capacity = *psVar19;
                name.field_2._8_8_ = plVar13[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar19;
                name._M_dataplus._M_p = (pointer)*plVar13;
              }
              name._M_string_length = plVar13[1];
              *plVar13 = (long)psVar19;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&vertexShaderSource,"Vector subscript access with ","");
              plVar13 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar19 = (size_type *)(plVar13 + 2);
              if ((size_type *)*plVar13 == psVar19) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                fragTemplate.m_template.field_2._8_8_ = plVar13[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar13;
              }
              fragTemplate.m_template._M_string_length = plVar13[1];
              *plVar13 = (long)psVar19;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar18 = plVar13 + 2;
              if ((long *)*plVar13 == plVar18) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar18;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar13[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar18;
                params._M_t._M_impl._0_8_ = (long *)*plVar13;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar13[1];
              *plVar13 = (long)plVar18;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar19 = (size_type *)(plVar13 + 2);
              if ((size_type *)*plVar13 == psVar19) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                vertTemplate.m_template.field_2._8_8_ = plVar13[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar19;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar13;
              }
              vertTemplate.m_template._M_string_length = plVar13[1];
              *plVar13 = (long)psVar19;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10
              ;
              pp_Var20 = (_func_int **)(plVar13 + 2);
              if ((_func_int **)*plVar13 == pp_Var20) {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar13[3];
              }
              else {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar13;
              }
              frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar13[1];
              *plVar13 = (long)pp_Var20;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&frag);
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              pp_Var20 = (_func_int **)(plVar13 + 2);
              if ((_func_int **)*plVar13 == pp_Var20) {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar13[3];
              }
              else {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar13;
              }
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar13[1];
              *plVar13 = (long)pp_Var20;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&vtx);
              desc._M_dataplus._M_p = (pointer)&desc.field_2;
              psVar19 = (size_type *)(plVar13 + 2);
              if ((size_type *)*plVar13 == psVar19) {
                desc.field_2._M_allocated_capacity = *psVar19;
                desc.field_2._8_8_ = plVar13[3];
              }
              else {
                desc.field_2._M_allocated_capacity = *psVar19;
                desc._M_dataplus._M_p = (pointer)*plVar13;
              }
              desc._M_string_length = plVar13[1];
              *plVar13 = (long)psVar19;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              _Var8._M_p = name._M_dataplus._M_p;
              _Var7._M_p = desc._M_dataplus._M_p;
              pCVar3 = (this->super_TestCaseGroup).m_context;
              GVar2 = this->m_glslVersion;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
              poVar30 = (ostringstream *)&frag;
              if (bVar34) {
                poVar30 = (ostringstream *)&vtx;
              }
              uVar9 = glu::getDataTypeMatrixNumColumns(DVar1);
              vecSize = glu::getDataTypeMatrixNumRows(DVar1);
              pcVar25 = getIntUniformName(uVar9);
              dataType = glu::getDataTypeFloatVec(vecSize);
              pcVar27 = glu::getGLSLVersionDeclaration(GVar2);
              if (pcVar27 == (char *)0x0) {
                std::ios::clear((int)&vertTemplate +
                                (int)vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                     _vptr_basic_ostream[-3] + 0x1a8);
              }
              else {
                sVar14 = strlen(pcVar27);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar27,sVar14);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              pcVar27 = glu::getGLSLVersionDeclaration(GVar2);
              if (pcVar27 == (char *)0x0) {
                std::ios::clear((int)&vertTemplate +
                                (int)frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                     _vptr_basic_ostream[-3] + 800);
              }
              else {
                sVar14 = strlen(pcVar27);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar27,sVar14);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "in highp vec4 a_position;\n",0x1a);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "in highp vec4 a_coords;\n",0x18);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                         "layout(location = 0) out mediump vec4 o_color;\n",0x2f);
              if (bVar34 == false) {
                lVar22 = 0x1a;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "out mediump vec4 v_coords;\n",0x1b);
                pcVar27 = "in mediump vec4 v_coords;\n";
              }
              else {
                lVar22 = 0x19;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "out mediump vec4 v_color;\n",0x1a);
                pcVar27 = "in mediump vec4 v_color;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar27,lVar22);
              if (iVar5 == 1 || iVar23 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30,"uniform mediump int ui_zero",0x1b);
                if (((1 < (int)uVar9) &&
                    (std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)poVar30,", ui_one",8), uVar9 != 2)) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar30,", ui_two",8), 3 < uVar9)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30,", ui_three",10);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar30,";\n",2);
              }
              iVar6 = (int)poVar30;
              if (iVar5 == 3 || iVar23 == 3) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30,"uniform mediump int ",0x14);
                if (pcVar25 == (char *)0x0) {
                  std::ios::clear(iVar6 + (int)*(undefined8 *)(*(long *)poVar30 + -0x18));
                }
                else {
                  sVar14 = strlen(pcVar25);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30,pcVar25,sVar14);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar30,";\n",2);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "    gl_Position = a_position;\n",0x1e);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",
                         0xc);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
              pcVar27 = " ${PRECISION} vec4 coords = v_coords;\n";
              if (bVar34 != false) {
                pcVar27 = " ${PRECISION} vec4 coords = a_coords;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar30,pcVar27,0x26);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar30," ${PRECISION} ${MAT_TYPE} tmp;\n",0x1f);
              if (((ulong)local_3d8 & 1) == 0) {
                if (iVar23 == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30," tmp[ui_zero]  = ${VEC_TYPE}(coords);\n",0x26);
                  if ((1 < (int)uVar9) &&
                     (std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar30,
                                 "   tmp[ui_one]   = ${VEC_TYPE}(coords.yzwx) * 0.5;\n",0x33),
                     uVar9 != 2)) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar30,
                               "   tmp[ui_two]   = ${VEC_TYPE}(coords.zwxy) * 0.25;\n",0x34);
                    lVar22 = 0x35;
                    pcVar27 = "   tmp[ui_three] = ${VEC_TYPE}(coords.wxyz) * 0.125;\n";
                    goto LAB_00d95523;
                  }
                }
                else {
                  if (iVar10 == 2) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar30," for (int i = 0; i < ",0x15);
                    poVar16 = (ostringstream *)std::ostream::operator<<(poVar30,uVar9);
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar30," for (int i = 0; i < ",0x15);
                    poVar16 = poVar30;
                    if (pcVar25 == (char *)0x0) {
                      std::ios::clear(iVar6 + (int)*(undefined8 *)(*(long *)poVar30 + -0x18));
                    }
                    else {
                      sVar14 = strlen(pcVar25);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar30,pcVar25,sVar14);
                    }
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar16,"; i++)\n",7);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar30," {\n",3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30,"     tmp[i] = ${VEC_TYPE}(coords);\n",0x23);
                  lVar22 = 3;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30,"     coords = coords.yzwx * 0.5;\n",0x21);
                  pcVar27 = " }\n";
LAB_00d95607:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30,pcVar27,lVar22);
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30," tmp[0] = ${VEC_TYPE}(coords);\n",0x1f);
                if ((1 < (int)uVar9) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar30,"   tmp[1] = ${VEC_TYPE}(coords.yzwx) * 0.5;\n",
                               0x2c), uVar9 != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30,"   tmp[2] = ${VEC_TYPE}(coords.zwxy) * 0.25;\n",
                             0x2d);
                  lVar22 = 0x2e;
                  pcVar27 = "   tmp[3] = ${VEC_TYPE}(coords.wxyz) * 0.125;\n";
LAB_00d95523:
                  if (3 < uVar9) goto LAB_00d95607;
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar30," ${PRECISION} ${VEC_TYPE} res = ${VEC_TYPE}(0.0);\n",
                         0x32);
              if (((ulong)local_3d8 & 1) == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30," res += tmp[0];\n",0x10);
                if ((1 < (int)uVar9) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar30,"   res += tmp[1];\n",0x12), uVar9 != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30,"   res += tmp[2];\n",0x12);
                  lVar22 = 0x12;
                  pcVar25 = "    res += tmp[3];\n";
LAB_00d956f9:
                  pcVar25 = pcVar25 + 1;
                  if (3 < uVar9) goto LAB_00d9579c;
                }
              }
              else if (iVar5 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30," res += tmp[ui_zero];\n",0x16);
                if ((1 < (int)uVar9) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar30,"   res += tmp[ui_one];\n",0x17), uVar9 != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30,"   res += tmp[ui_two];\n",0x17);
                  lVar22 = 0x19;
                  pcVar25 = "    res += tmp[ui_three];\n";
                  goto LAB_00d956f9;
                }
              }
              else {
                if (iVar5 == 2) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30," for (int i = 0; i < ",0x15);
                  poVar16 = (ostringstream *)std::ostream::operator<<(poVar30,uVar9);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar30," for (int i = 0; i < ",0x15);
                  poVar16 = poVar30;
                  if (pcVar25 == (char *)0x0) {
                    std::ios::clear(iVar6 + (int)*(undefined8 *)(*(long *)poVar30 + -0x18));
                  }
                  else {
                    sVar14 = strlen(pcVar25);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar30,pcVar25,sVar14);
                  }
                }
                lVar22 = 0x14;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16,"; i++)\n",7);
                pcVar25 = "     res += tmp[i];\n";
LAB_00d9579c:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar30,pcVar25,lVar22);
              }
              if (bVar34 == false) {
                lVar22 = 0x22;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "    v_coords = a_coords;\n",0x19);
                pcVar25 = "   o_color = vec4(res${PADDING});\n";
              }
              else {
                lVar22 = 0x16;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "    v_color = vec4(res${PADDING});\n",0x23);
                pcVar25 = "   o_color = v_color;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar25,lVar22);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header;
              params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])"MAT_TYPE",(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(dataType);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])"VEC_TYPE",(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])0x1cb041f,(char (*) [8])0x1bbd4ed);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if (vecSize == 3) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x1b7b051);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else if (vecSize == 2) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x1b7b04c);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",
                           (char (*) [1])(glcts::fixed_sample_locations_values + 1));
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                         (allocator<char> *)&local_3f8);
              tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,local_3f8._M_dataplus._M_p,&local_459);
              tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                local_3f8.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
              tcu::StringTemplate::specialize(&local_3f8,&fragTemplate,&params);
              if (uVar17 < 9) {
                p_Var31 = (ShaderEvalFunc)(&PTR_evalSubscriptMat2_0210afe8)[uVar17];
              }
              else {
                p_Var31 = (ShaderEvalFunc)0x0;
              }
              pSVar15 = (ShaderIndexingCase *)operator_new(0x130);
              ShaderIndexingCase::ShaderIndexingCase
                        (pSVar15,pCVar3,_Var8._M_p,_Var7._M_p,bVar34,DVar1,p_Var31,
                         vertexShaderSource._M_dataplus._M_p,local_3f8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                local_3f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::~StringTemplate(&fragTemplate);
              tcu::StringTemplate::~StringTemplate(&vertTemplate);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&params._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
              tcu::TestNode::addChild(pTVar11,(TestNode *)pSVar15);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)desc._M_dataplus._M_p != &desc.field_2) {
                operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
              lVar22 = 1;
              bVar35 = bVar34 != false;
              bVar34 = false;
            } while (bVar35);
            iVar10 = iVar10 + 1;
          } while (iVar10 != 4);
          uVar32 = (ulong)local_3d8 & 1;
          local_3d8 = (Context *)((ulong)local_3d8 & 0xffffffff00000000);
        } while (uVar32 != 0);
        local_330 = local_330 + 1;
        if (local_330 == 9) {
          return 4;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

void ShaderIndexingTests::init(void)
{
	static const DataType s_floatAndVecTypes[] = { TYPE_FLOAT, TYPE_FLOAT_VEC2, TYPE_FLOAT_VEC3, TYPE_FLOAT_VEC4 };

	static const ShaderType s_shaderTypes[] = { SHADERTYPE_VERTEX, SHADERTYPE_FRAGMENT };

	// Varying array access cases.
	{
		TestCaseGroup* varyingGroup = new TestCaseGroup(m_context, "varying_array", "Varying array access tests.");
		addChild(varyingGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int vertAccess = 0; vertAccess < INDEXACCESS_LAST; vertAccess++)
			{
				for (int fragAccess = 0; fragAccess < INDEXACCESS_LAST; fragAccess++)
				{
					if (vertAccess == INDEXACCESS_STATIC && fragAccess == INDEXACCESS_STATIC)
						continue;

					const char* vertAccessName = getIndexAccessTypeName((IndexAccessType)vertAccess);
					const char* fragAccessName = getIndexAccessTypeName((IndexAccessType)fragAccess);
					string		name =
						string(getDataTypeName(varType)) + "_" + vertAccessName + "_write_" + fragAccessName + "_read";
					string desc = string("Varying array with ") + vertAccessName + " write in vertex shader and " +
								  fragAccessName + " read in fragment shader.";
					varyingGroup->addChild(createVaryingArrayCase(m_context, name.c_str(), desc.c_str(), m_glslVersion,
																  varType, (IndexAccessType)vertAccess,
																  (IndexAccessType)fragAccess));
				}
			}
		}
	}

	// Uniform array access cases.
	{
		TestCaseGroup* uniformGroup = new TestCaseGroup(m_context, "uniform_array", "Uniform array access tests.");
		addChild(uniformGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
			{
				const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);
				for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
				{
					ShaderType  shaderType	 = s_shaderTypes[shaderTypeNdx];
					const char* shaderTypeName = getShaderTypeName((ShaderType)shaderType);
					string name = string(getDataTypeName(varType)) + "_" + readAccessName + "_read_" + shaderTypeName;
					string desc =
						string("Uniform array with ") + readAccessName + " read in " + shaderTypeName + " shader.";
					bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
					uniformGroup->addChild(createUniformArrayCase(m_context, name.c_str(), desc.c_str(), m_glslVersion,
																  isVertexCase, varType, (IndexAccessType)readAccess));
				}
			}
		}
	}

	// Temporary array access cases.
	{
		TestCaseGroup* tmpGroup = new TestCaseGroup(m_context, "tmp_array", "Temporary array access tests.");
		addChild(tmpGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int isReadStatic = 0; isReadStatic < 2; isReadStatic++)
			{
				for (int access = INDEXACCESS_STATIC + 1; access < INDEXACCESS_LAST; access++)
				{
					IndexAccessType readAccess  = isReadStatic ? INDEXACCESS_STATIC : (IndexAccessType)access;
					IndexAccessType writeAccess = isReadStatic ? (IndexAccessType)access : INDEXACCESS_STATIC;

					const char* writeAccessName = getIndexAccessTypeName(writeAccess);
					const char* readAccessName  = getIndexAccessTypeName(readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType  shaderType	 = s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName = getShaderTypeName((ShaderType)shaderType);
						string		name = string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" +
									  readAccessName + "_read_" + shaderTypeName;
						string desc = string("Temporary array with ") + writeAccessName + " write and " +
									  readAccessName + " read in " + shaderTypeName + " shader.";
						bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						tmpGroup->addChild(createTmpArrayCase(m_context, name.c_str(), desc.c_str(), m_glslVersion,
															  isVertexCase, varType, (IndexAccessType)writeAccess,
															  (IndexAccessType)readAccess));
					}
				}
			}
		}
	}

	// Vector indexing with subscripts.
	{
		TestCaseGroup* vecGroup = new TestCaseGroup(m_context, "vector_subscript", "Vector subscript indexing.");
		addChild(vecGroup);

		static const DataType s_vectorTypes[] = { TYPE_FLOAT_VEC2, TYPE_FLOAT_VEC3, TYPE_FLOAT_VEC4 };

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_vectorTypes); typeNdx++)
		{
			DataType varType = s_vectorTypes[typeNdx];
			for (int isReadDirect = 0; isReadDirect < 2; isReadDirect++)
			{
				for (int access = SUBSCRIPT_STATIC; access < VECTORACCESS_LAST; access++)
				{
					VectorAccessType readAccess  = isReadDirect ? DIRECT : (VectorAccessType)access;
					VectorAccessType writeAccess = isReadDirect ? (VectorAccessType)access : DIRECT;

					const char* writeAccessName = getVectorAccessTypeName(writeAccess);
					const char* readAccessName  = getVectorAccessTypeName(readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType  shaderType	 = s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName = getShaderTypeName((ShaderType)shaderType);
						string		name = string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" +
									  readAccessName + "_read_" + shaderTypeName;
						string desc = string("Vector subscript access with ") + writeAccessName + " write and " +
									  readAccessName + " read in " + shaderTypeName + " shader.";
						bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						vecGroup->addChild(createVectorSubscriptCase(
							m_context, name.c_str(), desc.c_str(), m_glslVersion, isVertexCase, varType,
							(VectorAccessType)writeAccess, (VectorAccessType)readAccess));
					}
				}
			}
		}
	}

	// Matrix indexing with subscripts.
	{
		TestCaseGroup* matGroup = new TestCaseGroup(m_context, "matrix_subscript", "Matrix subscript indexing.");
		addChild(matGroup);

		static const DataType s_matrixTypes[] = { TYPE_FLOAT_MAT2,   TYPE_FLOAT_MAT2X3, TYPE_FLOAT_MAT2X4,
												  TYPE_FLOAT_MAT3X2, TYPE_FLOAT_MAT3,   TYPE_FLOAT_MAT3X4,
												  TYPE_FLOAT_MAT4X2, TYPE_FLOAT_MAT4X3, TYPE_FLOAT_MAT4 };

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_matrixTypes); typeNdx++)
		{
			DataType varType = s_matrixTypes[typeNdx];
			for (int isReadStatic = 0; isReadStatic < 2; isReadStatic++)
			{
				for (int access = INDEXACCESS_STATIC + 1; access < INDEXACCESS_LAST; access++)
				{
					IndexAccessType readAccess  = isReadStatic ? INDEXACCESS_STATIC : (IndexAccessType)access;
					IndexAccessType writeAccess = isReadStatic ? (IndexAccessType)access : INDEXACCESS_STATIC;

					const char* writeAccessName = getIndexAccessTypeName(writeAccess);
					const char* readAccessName  = getIndexAccessTypeName(readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType  shaderType	 = s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName = getShaderTypeName((ShaderType)shaderType);
						string		name = string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" +
									  readAccessName + "_read_" + shaderTypeName;
						string desc = string("Vector subscript access with ") + writeAccessName + " write and " +
									  readAccessName + " read in " + shaderTypeName + " shader.";
						bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						matGroup->addChild(createMatrixSubscriptCase(
							m_context, name.c_str(), desc.c_str(), m_glslVersion, isVertexCase, varType,
							(IndexAccessType)writeAccess, (IndexAccessType)readAccess));
					}
				}
			}
		}
	}
}